

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.h
# Opt level: O2

string * llbuild::basic::escapeForJSON<llvm::StringRef>
                   (string *__return_storage_ptr__,StringRef *in)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  byte *pbVar4;
  ostream *poVar5;
  byte *pbVar6;
  char *pcVar7;
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  pbVar4 = (byte *)in->Data;
  pbVar6 = pbVar4;
  do {
    if (pbVar6 == pbVar4 + in->Length) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
      return __return_storage_ptr__;
    }
    bVar1 = *pbVar6;
    switch(bVar1) {
    case 8:
      pcVar7 = "\\b";
      break;
    case 9:
      pcVar7 = "\\t";
      break;
    case 10:
      pcVar7 = "\\n";
      break;
    case 0xb:
switchD_00120f65_caseD_b:
      if (bVar1 < 0x20) {
        poVar5 = std::operator<<((ostream *)&ss,"\\u");
        lVar2 = *(long *)poVar5;
        lVar3 = *(long *)(lVar2 + -0x18);
        *(uint *)(poVar5 + lVar3 + 0x18) = *(uint *)(poVar5 + lVar3 + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
        poVar5 = std::operator<<(poVar5,0x30);
        std::ostream::operator<<(poVar5,(int)(char)*pbVar6);
      }
      else {
        std::operator<<((ostream *)&ss,bVar1);
      }
      goto LAB_00121020;
    case 0xc:
      pcVar7 = "\\f";
      break;
    case 0xd:
      pcVar7 = "\\r";
      break;
    default:
      if (bVar1 == 0x22) {
        pcVar7 = "\\\"";
      }
      else {
        if (bVar1 != 0x5c) goto switchD_00120f65_caseD_b;
        pcVar7 = "\\\\";
      }
    }
    std::operator<<((ostream *)&ss,pcVar7);
LAB_00121020:
    pbVar6 = pbVar6 + 1;
    pbVar4 = (byte *)in->Data;
  } while( true );
}

Assistant:

std::string escapeForJSON(String const& in) {
    std::ostringstream ss;
    for (auto i = in.begin(); i != in.end(); i++) {
      switch (*i) {
      case '\\': ss << "\\\\"; break;
      case '"': ss << "\\\""; break;
      case '\b': ss << "\\b"; break;
      case '\n': ss << "\\n"; break;
      case '\f': ss << "\\f"; break;
      case '\r': ss << "\\r"; break;
      case '\t': ss << "\\t"; break;
      default:
        if ('\x00' <= *i && *i <= '\x1f') {
          ss << "\\u" << std::hex << std::setw(4) << std::setfill('0')
             << (int)*i;
        } else {
          ss << *i;
        }
      }
    }
    return ss.str();
  }